

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_nearest_element
          (REF_SEARCH ref_search,REF_INT node_per,REF_DBL *xyz,REF_DBL *position,REF_DBL *distance)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT parent;
  REF_DBL *distance_local;
  REF_DBL *position_local;
  REF_DBL *xyz_local;
  REF_INT node_per_local;
  REF_SEARCH ref_search_local;
  
  if (node_per == 2) {
    uVar1 = ref_search_gather_seg(ref_search,xyz,0,position,distance);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x18b,"ref_search_nearest_element",(ulong)uVar1,"touches");
      return uVar1;
    }
  }
  else {
    uVar1 = ref_search_gather_tri(ref_search,xyz,0,position,distance);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x18e,"ref_search_nearest_element",(ulong)uVar1,"touches");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_nearest_element(REF_SEARCH ref_search,
                                              REF_INT node_per, REF_DBL *xyz,
                                              REF_DBL *position,
                                              REF_DBL *distance) {
  REF_INT parent;
  parent = 0;
  if (2 == node_per) {
    RSS(ref_search_gather_seg(ref_search, xyz, parent, position, distance),
        "touches");
  } else {
    RSS(ref_search_gather_tri(ref_search, xyz, parent, position, distance),
        "touches");
  }
  return REF_SUCCESS;
}